

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O1

void __thiscall Board::set_position(Board *this,Ship *ship)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  if ((ship->length == 1) && (ship->ID == 'S')) {
    lVar10 = *(long *)&(this->matrix).
                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[ship->sRow].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data;
    lVar8 = (long)ship->sCol * 0x20;
    std::__cxx11::string::_M_replace(lVar10 + lVar8,0,*(char **)(lVar10 + 8 + lVar8),0x1060f5);
  }
  if (ship->orientation == 'V') {
    if (ship->direction == -2) {
      iVar3 = ship->length;
      if (0 < iVar3) {
        iVar7 = ship->sRow;
        lVar8 = (long)iVar7;
        lVar10 = lVar8 * 0x18;
        do {
          pcVar5 = anon_var_dwarf_448f;
          if ((int)lVar8 == (iVar7 - iVar3) + 1) {
            pcVar5 = anon_var_dwarf_4499;
          }
          if ((int)lVar8 == iVar7) {
            pcVar5 = anon_var_dwarf_44a3;
          }
          lVar2 = *(long *)((long)&(((this->matrix).
                                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data + lVar10);
          lVar9 = (long)ship->sCol * 0x20;
          std::__cxx11::string::_M_replace
                    (lVar2 + lVar9,0,*(char **)(lVar2 + 8 + lVar9),(ulong)pcVar5);
          lVar8 = lVar8 + -1;
          iVar3 = ship->length;
          iVar7 = ship->sRow;
          lVar10 = lVar10 + -0x18;
        } while (iVar7 - iVar3 < lVar8);
      }
    }
    else if ((ship->direction == 2) && (0 < ship->length)) {
      uVar1 = ship->sRow;
      uVar4 = (ulong)uVar1;
      uVar6 = (ulong)(ship->length + uVar1);
      lVar8 = (long)(int)uVar1;
      lVar10 = lVar8 * 0x18;
      do {
        pcVar5 = anon_var_dwarf_448f;
        if ((int)lVar8 == (int)uVar6 + -1) {
          pcVar5 = anon_var_dwarf_44a3;
        }
        if ((int)lVar8 == (int)uVar4) {
          pcVar5 = anon_var_dwarf_4499;
        }
        lVar2 = *(long *)((long)&(((this->matrix).
                                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data + lVar10);
        lVar9 = (long)ship->sCol * 0x20;
        std::__cxx11::string::_M_replace
                  (lVar2 + lVar9,0,*(char **)(lVar2 + 8 + lVar9),(ulong)pcVar5);
        lVar8 = lVar8 + 1;
        uVar4 = (ulong)ship->sRow;
        uVar6 = (long)ship->length + uVar4;
        lVar10 = lVar10 + 0x18;
      } while (lVar8 < (long)uVar6);
    }
  }
  else if (ship->orientation == 'H') {
    if (ship->direction == -1) {
      iVar3 = ship->length;
      if (0 < iVar3) {
        iVar7 = ship->sCol;
        lVar8 = (long)iVar7;
        lVar10 = lVar8 << 5;
        do {
          pcVar5 = anon_var_dwarf_448f;
          if ((int)lVar8 == (iVar7 - iVar3) + 1) {
            pcVar5 = anon_var_dwarf_447b;
          }
          if ((int)lVar8 == iVar7) {
            pcVar5 = anon_var_dwarf_4485;
          }
          lVar2 = *(long *)&(this->matrix).
                            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[ship->sRow].
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data;
          std::__cxx11::string::_M_replace
                    (lVar2 + lVar10,0,*(char **)(lVar2 + 8 + lVar10),(ulong)pcVar5);
          lVar8 = lVar8 + -1;
          iVar3 = ship->length;
          iVar7 = ship->sCol;
          lVar10 = lVar10 + -0x20;
        } while (iVar7 - iVar3 < lVar8);
      }
    }
    else if ((ship->direction == 1) && (0 < ship->length)) {
      uVar1 = ship->sCol;
      uVar4 = (ulong)uVar1;
      uVar6 = (ulong)(ship->length + uVar1);
      lVar8 = (long)(int)uVar1;
      lVar10 = lVar8 << 5;
      do {
        pcVar5 = anon_var_dwarf_448f;
        if ((int)lVar8 == (int)uVar6 + -1) {
          pcVar5 = anon_var_dwarf_4485;
        }
        if ((int)lVar8 == (int)uVar4) {
          pcVar5 = anon_var_dwarf_447b;
        }
        lVar2 = *(long *)&(this->matrix).
                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[ship->sRow].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data;
        std::__cxx11::string::_M_replace
                  (lVar2 + lVar10,0,*(char **)(lVar2 + 8 + lVar10),(ulong)pcVar5);
        lVar8 = lVar8 + 1;
        uVar4 = (ulong)ship->sCol;
        uVar6 = (long)ship->length + uVar4;
        lVar10 = lVar10 + 0x20;
      } while (lVar8 < (long)uVar6);
    }
  }
  return;
}

Assistant:

void set_position( Ship *ship )
        {
            if( ship->length == 1 and ship->ID == 'S')
            {
                matrix[ship->sRow][ship->sCol] = "⬤";
            }

            if( ship->orientation == 'H' )
            {
                if( ship->direction == 1 )
                {
                    for( int j = ship->sCol; j < ship->sCol + ship->length; j++ )
                    {
                        if( j == ship->sCol )
                        {
                            matrix[ship->sRow][j] = "◀";
                        }
                        else if( j == ship->sCol + ship->length - 1 )
                        {
                            matrix[ship->sRow][j] = "▶";
                        }
                        else
                        {
                            matrix[ship->sRow][j] = "■";
                        }
                    }
                }
                else if( ship->direction == -1 )
                { 
                    for( int j = ship->sCol; j > ship->sCol - ship->length; j-- )
                    { 
                        if( j == ship->sCol )
                        {
                            matrix[ship->sRow][j] = "▶";
                        }
                        else if( j == ship->sCol - ( ship->length - 1 ) )
                        {
                            matrix[ship->sRow][j] = "◀";
                        }
                        else
                        {
                            matrix[ship->sRow][j] = "■";
                        }
                    }
                }
            }
            else if( ship->orientation == 'V' )
            {
                if( ship->direction == 2 )
                {
                    for( int i = ship->sRow; i < ship->sRow + ship->length; i++ )
                    {
                        if( i == ship->sRow )
                        {
                            matrix[i][ship->sCol] = "▲";
                        }
                        else if( i == ship->sRow + ship->length - 1 )
                        {
                            matrix[i][ship->sCol] = "▼";
                        }
                        else
                        {
                            matrix[i][ship->sCol] = "■";
                        }
                    }
                }
                else if( ship->direction == -2 )
                {
                    for( int i = ship->sRow; i > ship->sRow - ship->length; i-- )
                    { 
                        if( i == ship->sRow )
                        {
                            matrix[i][ship->sCol] = "▼";
                        }
                        else if( i == ship->sRow - ( ship->length - 1 ) )
                        {
                            matrix[i][ship->sCol] = "▲";
                        }
                        else
                        {
                            matrix[i][ship->sCol] = "■";
                        }
                    }
                }
             }
        }